

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int inlist(char *filename)

{
  int iVar1;
  size_t sVar2;
  char **local_28;
  char **filelist;
  int len;
  char *filename_local;
  
  sVar2 = strlen(filename);
  local_28 = files;
  if (*files != (char *)0x0) {
    do {
      if (*local_28 == (char *)0x0) {
        return 0;
      }
      iVar1 = strncmp(filename,*local_28,(long)(int)sVar2);
      local_28 = local_28 + 1;
    } while (iVar1 != 0);
  }
  return 1;
}

Assistant:

int
inlist(char *filename)
{
	register int len = strlen(filename);
	register char **filelist = files;

	if (!*filelist)
		return (1);				/* no "files list" */

	while (*filelist)
#ifdef __MSDOS__
		if (strnicmp(filename, *filelist++, len) == 0)
#else
		if (strncmp(filename, *filelist++, len) == 0)
#endif							/* __MSDOS__ */
			return (1);
	return (0);
}